

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls1_record_handshake_hashes_for_channel_id(SSL_HANDSHAKE *hs)

{
  SSL *pSVar1;
  bool bVar2;
  pointer psVar3;
  size_t sVar4;
  uchar *out;
  size_t local_28;
  size_t digest_len;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  digest_len = (size_t)hs->ssl;
  ssl = (SSL *)hs;
  bVar2 = std::operator!=(&((SSL *)digest_len)->session,(nullptr_t)0x0);
  if (bVar2) {
    hs_local._7_1_ = false;
  }
  else {
    psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                       ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                        &ssl[9].renegotiate_mode);
    sVar4 = SSLTranscript::DigestLen((SSLTranscript *)&ssl[3].max_send_fragment);
    InplaceVector<unsigned_char,_64UL>::ResizeForOverwrite(&psVar3->original_handshake_hash,sVar4);
    pSVar1 = ssl + 3;
    psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                       ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                        &ssl[9].renegotiate_mode);
    out = InplaceVector<unsigned_char,_64UL>::data(&psVar3->original_handshake_hash);
    bVar2 = SSLTranscript::GetHash((SSLTranscript *)&pSVar1->max_send_fragment,out,&local_28);
    if (bVar2) {
      psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                          &ssl[9].renegotiate_mode);
      sVar4 = InplaceVector<unsigned_char,_64UL>::size(&psVar3->original_handshake_hash);
      if (local_28 != sVar4) {
        __assert_fail("digest_len == hs->new_session->original_handshake_hash.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x1276,
                      "bool bssl::tls1_record_handshake_hashes_for_channel_id(SSL_HANDSHAKE *)");
      }
      hs_local._7_1_ = true;
    }
    else {
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

bool tls1_record_handshake_hashes_for_channel_id(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  // This function should never be called for a resumed session because the
  // handshake hashes that we wish to record are for the original, full
  // handshake.
  if (ssl->session != NULL) {
    return false;
  }

  size_t digest_len;
  hs->new_session->original_handshake_hash.ResizeForOverwrite(
      hs->transcript.DigestLen());
  if (!hs->transcript.GetHash(hs->new_session->original_handshake_hash.data(),
                              &digest_len)) {
    return false;
  }
  assert(digest_len == hs->new_session->original_handshake_hash.size());
  return true;
}